

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkAbsAddToNodeFrames(Vec_Int_t *vNodeFrames,Vec_Int_t *vLevel)

{
  int iVar1;
  undefined4 local_1c;
  int Entry;
  int i;
  Vec_Int_t *vLevel_local;
  Vec_Int_t *vNodeFrames_local;
  
  for (local_1c = 0; iVar1 = Vec_IntSize(vLevel), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(vLevel,local_1c);
    Vec_IntPushUnique(vNodeFrames,iVar1);
  }
  Vec_IntSort(vNodeFrames,0);
  return;
}

Assistant:

void Wlc_NtkAbsAddToNodeFrames( Vec_Int_t * vNodeFrames, Vec_Int_t * vLevel ) 
{
    int i, Entry;
    Vec_IntForEachEntry( vLevel, Entry, i )
        Vec_IntPushUnique( vNodeFrames, Entry );
    Vec_IntSort( vNodeFrames, 0 );
}